

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimPatResim(Gia_Man_t *pGia,Vec_Int_t *vObjs,int nWords,Vec_Wrd_t *vSims)

{
  word *pwVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  ulong uVar5;
  Vec_Wrd_t *in_R8;
  int i;
  
  uVar5 = 0;
  i = 0;
  if (0 < nWords) {
    uVar5 = (ulong)(uint)nWords;
    i = 0;
  }
  while( true ) {
    if (vObjs->nSize <= i) {
      return;
    }
    iVar2 = Vec_IntEntry(vObjs,i);
    pObj = Gia_ManObj(pGia,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if (i == 0) {
      iVar2 = Gia_ObjId(pGia,pObj);
      pwVar1 = vSims->pArray;
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        pwVar1[(long)(iVar2 * nWords) + uVar4] = ~pwVar1[(long)(iVar2 * nWords) + uVar4];
      }
    }
    else {
      iVar2 = (int)*(ulong *)pObj;
      uVar4 = *(ulong *)pObj & 0x1fffffff;
      if (uVar4 == 0x1fffffff || iVar2 < 0) {
        if ((-1 < iVar2) || ((int)uVar4 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                        ,0x91,"void Gia_ManSimPatResim(Gia_Man_t *, Vec_Int_t *, int, Vec_Wrd_t *)")
          ;
        }
      }
      else {
        uVar3 = Gia_ObjId(pGia,pObj);
        Gia_ManSimPatSimAnd((Gia_Man_t *)(ulong)uVar3,(int)pObj,(Gia_Obj_t *)(ulong)(uint)nWords,
                            (int)vSims,in_R8);
      }
    }
    i = i + 1;
  }
  return;
}

Assistant:

void Gia_ManSimPatResim( Gia_Man_t * pGia, Vec_Int_t * vObjs, int nWords, Vec_Wrd_t * vSims )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachObjVec( vObjs, pGia, pObj, i )
        if ( i == 0 )
            Gia_ManSimPatSimNot( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimPatSimAnd( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
        else if ( !Gia_ObjIsCo(pObj) ) assert(0);
}